

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool __thiscall GEO::Environment::notify_observers(Environment *this,string *name,bool recursive)

{
  bool bVar1;
  undefined1 local_40 [8];
  string value;
  bool recursive_local;
  string *name_local;
  Environment *this_local;
  
  get_value((Environment *)local_40,(string *)this);
  bVar1 = notify_observers(this,name,(string *)local_40,recursive);
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool Environment::notify_observers(
        const std::string& name, bool recursive
    ) {
        std::string value = get_value(name);
        return notify_observers(name, value, recursive);
    }